

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_draw_command * nk_draw_list_command_last(nk_draw_list *list)

{
  void *pvVar1;
  nk_size nVar2;
  long in_RDI;
  nk_draw_command *cmd;
  nk_size size;
  void *memory;
  
  pvVar1 = nk_buffer_memory(*(nk_buffer **)(in_RDI + 0xb0));
  nVar2 = nk_buffer_total(*(nk_buffer **)(in_RDI + 0xb0));
  return (nk_draw_command *)
         ((long)pvVar1 +
         (ulong)(*(int *)(in_RDI + 0xd0) - 1) * -0x20 + (nVar2 - *(long *)(in_RDI + 0xd8)));
}

Assistant:

NK_INTERN struct nk_draw_command*
nk_draw_list_command_last(struct nk_draw_list *list)
{
void *memory;
nk_size size;
struct nk_draw_command *cmd;
NK_ASSERT(list->cmd_count);

memory = nk_buffer_memory(list->buffer);
size = nk_buffer_total(list->buffer);
cmd = nk_ptr_add(struct nk_draw_command, memory, size - list->cmd_offset);
return (cmd - (list->cmd_count-1));
}